

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLine.cpp
# Opt level: O3

void __thiscall ProxyLine::onClosed(ProxyLine *this)

{
  char **ppcVar1;
  char **local_30;
  char *local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  local_30 = &local_28;
  local_10 = 0;
  local_28 = "Closed by proxy server";
  local_20 = 0x16;
  (*this->_callback->_vptr_ICallback[1])(this->_callback,this,&local_30);
  if (local_30[3] != (char *)0x0) {
    LOCK();
    ppcVar1 = local_30 + 3;
    *ppcVar1 = *ppcVar1 + -1;
    UNLOCK();
    if ((*ppcVar1 == (char *)0x0) && (local_30 != (char **)0x0)) {
      operator_delete__(local_30);
    }
  }
  return;
}

Assistant:

void ProxyLine::onClosed()
{
    _callback.onClosed(*this, "Closed by proxy server");
}